

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O2

void __thiscall QScanConverter::scanConvert<true>(QScanConverter *this)

{
  qsizetype *pqVar1;
  int iVar2;
  Line **ppLVar3;
  long lVar4;
  ulong uVar5;
  int y;
  uint uVar6;
  long lVar7;
  int x;
  int iVar8;
  Line *l;
  Line *pLVar9;
  uint uVar10;
  
  if ((this->m_lines).siz != 0) {
    std::
    __sort<QScanConverter::Line*,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<true>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              ();
    pqVar1 = &(this->m_active).siz;
    lVar4 = 0;
    for (y = ((this->m_lines).buffer)->top; y <= this->m_bottom; y = y + 1) {
      for (lVar4 = (long)(int)lVar4; lVar4 < (this->m_lines).siz; lVar4 = lVar4 + 1) {
        pLVar9 = (this->m_lines).buffer;
        uVar5 = (this->m_active).siz;
        if (pLVar9[lVar4].top != y) goto LAB_003ce6fc;
        pLVar9 = pLVar9 + lVar4;
        QDataBuffer<QScanConverter::Line_*>::resize(&this->m_active,uVar5 + 1);
        for (uVar5 = (ulong)((int)*pqVar1 + -2); ppLVar3 = (this->m_active).buffer, -1 < (int)uVar5;
            uVar5 = uVar5 - 1) {
          if (ppLVar3[uVar5 & 0xffffffff]->x <= pLVar9->x) break;
          ppLVar3[(uVar5 & 0xffffffff) + 1] = ppLVar3[uVar5 & 0xffffffff];
        }
        ppLVar3[uVar5 + 1] = pLVar9;
      }
      uVar5 = *pqVar1;
LAB_003ce6fc:
      uVar6 = 0;
      x = 0;
      for (iVar8 = 0; iVar8 < (int)uVar5; iVar8 = iVar8 + 1) {
        lVar7 = (long)iVar8;
        pLVar9 = (this->m_active).buffer[lVar7];
        iVar2 = *(int *)((long)&pLVar9->x + 2);
        if ((this->m_fillRuleMask & uVar6) != 0) {
          QSpanBuffer::addSpan(this->m_spanBuffer,x,iVar2 - x,y,0xff);
        }
        uVar6 = uVar6 + pLVar9->winding;
        if (pLVar9->bottom == y) {
          uVar10 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar10;
          for (; lVar7 < (int)uVar10; lVar7 = lVar7 + 1) {
            ppLVar3 = (this->m_active).buffer;
            ppLVar3[lVar7] = ppLVar3[lVar7 + 1];
          }
          QDataBuffer<QScanConverter::Line_*>::resize(&this->m_active,(long)(int)uVar10);
          iVar8 = iVar8 + -1;
        }
        x = iVar2;
      }
    }
  }
  (this->m_active).siz = 0;
  return;
}

Assistant:

void QScanConverter::scanConvert()
{
    if (!m_lines.size()) {
        m_active.reset();
        return;
    }
    constexpr auto topOrder = [](const Line &a, const Line &b) {
        return a.top < b.top;
    };
    constexpr auto xOrder = [](const Line *a, const Line *b) {
        return a->x < b->x;
    };

    std::sort(m_lines.data(), m_lines.data() + m_lines.size(), topOrder);
    int line = 0;
    for (int y = m_lines.first().top; y <= m_bottom; ++y) {
        for (; line < m_lines.size() && m_lines.at(line).top == y; ++line) {
            // add node to active list
            if constexpr(AllVertical) {
                QScanConverter::Line *l = &m_lines.at(line);
                m_active.resize(m_active.size() + 1);
                int j;
                for (j = m_active.size() - 2; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            } else {
                m_active << &m_lines.at(line);
            }
        }

        int numActive = m_active.size();
        if constexpr(!AllVertical) {
            // use insertion sort instead of std::sort, as the active edge list is quite small
            // and in the average case already sorted
            for (int i = 1; i < numActive; ++i) {
                QScanConverter::Line *l = m_active.at(i);
                int j;
                for (j = i-1; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            }
        }

        int x = 0;
        int winding = 0;
        for (int i = 0; i < numActive; ++i) {
            QScanConverter::Line *node = m_active.at(i);

            const int current = QScFixedToInt(node->x);
            if (winding & m_fillRuleMask)
                m_spanBuffer->addSpan(x, current - x, y, 0xff);

            x = current;
            winding += node->winding;

            if (node->bottom == y) {
                // remove node from active list
                for (int j = i; j < numActive - 1; ++j)
                    m_active.at(j) = m_active.at(j+1);

                m_active.resize(--numActive);
                --i;
            } else {
                if constexpr(!AllVertical)
                    node->x += node->delta;
            }
        }
    }
    m_active.reset();
}